

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O1

void __thiscall
cppcms::session_pool::backend
          (session_pool *this,
          unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
          *b)

{
  session_api_factory *psVar1;
  session_api_factory *psVar2;
  
  psVar1 = (b->_M_t).
           super___uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::session_api_factory_*,_std::default_delete<cppcms::session_api_factory>_>
           .super__Head_base<0UL,_cppcms::session_api_factory_*,_false>._M_head_impl;
  (b->_M_t).
  super___uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::session_api_factory_*,_std::default_delete<cppcms::session_api_factory>_>
  .super__Head_base<0UL,_cppcms::session_api_factory_*,_false>._M_head_impl =
       (session_api_factory *)0x0;
  psVar2 = (this->backend_)._M_t.
           super___uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::session_api_factory_*,_std::default_delete<cppcms::session_api_factory>_>
           .super__Head_base<0UL,_cppcms::session_api_factory_*,_false>._M_head_impl;
  (this->backend_)._M_t.
  super___uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::session_api_factory_*,_std::default_delete<cppcms::session_api_factory>_>
  .super__Head_base<0UL,_cppcms::session_api_factory_*,_false>._M_head_impl = psVar1;
  if (psVar2 != (session_api_factory *)0x0) {
    (*psVar2->_vptr_session_api_factory[4])();
    return;
  }
  return;
}

Assistant:

void session_pool::backend(std::unique_ptr<session_api_factory> b)
{
	backend_=std::move(b);
}